

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *args_5;
  PropertySpecSyntax *args_6;
  PropertyDeclarationSyntax *pPVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor;
  AssertionItemPortListSyntax *local_78;
  Token local_70;
  Token local_60;
  Token local_50;
  DeepCloneVisitor visitor_1;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x70) == (SyntaxNode *)0x0) {
    local_78 = (AssertionItemPortListSyntax *)0x0;
  }
  else {
    local_78 = (AssertionItemPortListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x70),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  args_5 = deepClone<slang::syntax::LocalVariableDeclarationSyntax>
                     ((SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)(__fn + 0x88),
                      (BumpAllocator *)__child_stack);
  args_6 = (PropertySpecSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0xc0),&visitor_1,(BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 200),(BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0xd8),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xe8) == (SyntaxNode *)0x0) {
    _visitor_2 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_2 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0xe8),&visitor_2,(BumpAllocator *)__child_stack)
    ;
  }
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PropertyDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::AssertionItemPortListSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>&,slang::syntax::PropertySpecSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_50,&local_60,&local_78,
                      (Token *)&visitor,args_5,args_6,(Token *)&visitor_1,&local_70,
                      (NamedBlockClauseSyntax **)&visitor_2);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PropertyDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PropertyDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.portList ? deepClone(*node.portList, alloc) : nullptr,
        node.semi.deepClone(alloc),
        *deepClone(node.variables, alloc),
        *deepClone<PropertySpecSyntax>(*node.propertySpec, alloc),
        node.optionalSemi.deepClone(alloc),
        node.end.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}